

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

void __thiscall duckdb_snappy::SnappyIOVecReader::Skip(SnappyIOVecReader *this,size_t n)

{
  iovec *piVar1;
  size_t sVar2;
  ulong uVar3;
  iovec *piVar4;
  ulong uVar5;
  char *pcVar6;
  
  uVar3 = this->curr_size_remaining_;
  if (n == 0 || n < uVar3) {
    pcVar6 = this->curr_pos_;
    sVar2 = this->total_size_remaining_;
  }
  else {
    piVar4 = this->curr_iov_;
    sVar2 = this->total_size_remaining_;
    do {
      n = n - uVar3;
      uVar5 = uVar3;
      do {
        sVar2 = sVar2 - uVar5;
        if (sVar2 == 0) {
          this->total_size_remaining_ = 0;
          this->curr_pos_ = (char *)0x0;
          this->curr_size_remaining_ = 0;
          pcVar6 = (char *)0x0;
          uVar3 = 0;
          goto LAB_01cf3746;
        }
        piVar1 = piVar4 + 1;
        this->curr_iov_ = piVar1;
        uVar3 = piVar4[1].iov_len;
        uVar5 = 0;
        piVar4 = piVar1;
      } while (uVar3 == 0);
      pcVar6 = (char *)piVar1->iov_base;
LAB_01cf3746:
    } while ((n != 0) && (uVar3 <= n));
  }
  this->curr_size_remaining_ = uVar3 - n;
  this->total_size_remaining_ = sVar2 - n;
  this->curr_pos_ = pcVar6 + n;
  return;
}

Assistant:

void Skip(size_t n) override {
    while (n >= curr_size_remaining_ && n > 0) {
      n -= curr_size_remaining_;
      Advance();
    }
    curr_size_remaining_ -= n;
    total_size_remaining_ -= n;
    curr_pos_ += n;
  }